

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

void gen_assign(_node_t *node)

{
  sym_t *psVar1;
  char *__ptr;
  
  fwrite("; assign { \n",0xc,1,(FILE *)f);
  gen_expr(node->children[1]);
  psVar1 = gen_lvalue(*node->children);
  if (psVar1->type_id == 0x80) {
    __ptr = "        ld      [de], a\n";
  }
  else {
    fwrite("        ld      [de], l\n",0x18,1,(FILE *)f);
    fwrite("        inc     de\n",0x13,1,(FILE *)f);
    __ptr = "        ld      [de], h\n";
  }
  fwrite(__ptr,0x18,1,(FILE *)f);
  fwrite("; } assign \n",0xc,1,(FILE *)f);
  return;
}

Assistant:

void gen_assign(_node_t* node)
{
    sym_t* s;
    TODO("assign word");
    fprintf(f, "; assign { \n");
    gen_expr(node->children[RIGHTOP]);  /* Load byte into A or word into HL */

    s = gen_lvalue(node->children[LEFTOP]); /* Load ptr into DE */
    if (s->type_id == BYTE)
    {
        fprintf(f, "        ld      [de], a\n");
    }
    else
    {
        fprintf(f, "        ld      [de], l\n");
        fprintf(f, "        inc     de\n");
        fprintf(f, "        ld      [de], h\n");
    }

    fprintf(f, "; } assign \n");
}